

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::execution_is_noop(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRBlock *next;
  SPIRBlock *start;
  SPIRBlock *to_local;
  SPIRBlock *from_local;
  Compiler *this_local;
  
  bVar1 = execution_is_branchless(this,from,to);
  next = from;
  if (bVar1) {
    while( true ) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(next->super_IVariant).self);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(to->super_IVariant).self);
      if (uVar2 == uVar3) break;
      bVar1 = block_is_noop(this,next);
      if (!bVar1) {
        return false;
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&next->next_block);
      next = get<spirv_cross::SPIRBlock>(this,uVar2);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::execution_is_noop(const SPIRBlock &from, const SPIRBlock &to) const
{
	if (!execution_is_branchless(from, to))
		return false;

	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (!block_is_noop(*start))
			return false;

		auto &next = get<SPIRBlock>(start->next_block);
		start = &next;
	}
}